

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::compute_degree(Graph *this)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (this->num_vertices_ != 0) {
    pvVar1 = (this->succ_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->succ_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    pvVar2 = (this->pred_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    puVar3 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
    lVar9 = 2;
    uVar8 = 0;
    do {
      uVar7 = uVar6;
      if (((uVar6 < uVar8 || uVar6 - uVar8 == 0) ||
          (uVar7 = uVar4, uVar4 < uVar8 || uVar4 - uVar8 == 0)) || (uVar7 = uVar5, uVar5 <= uVar8))
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                   ,uVar7);
      }
      puVar3[uVar8] =
           (int)((ulong)(*(long *)((long)&(pvVar2->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data + lVar9 * 4) -
                        *(long *)((long)pvVar2 + lVar9 * 4 + -8)) >> 2) +
           (int)((ulong)(*(long *)((long)&(pvVar1->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl + lVar9 * 4) -
                        *(long *)((long)pvVar1 + lVar9 * 4 + -8)) >> 2);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 6;
    } while ((uint)uVar8 < this->num_vertices_);
  }
  return;
}

Assistant:

void Graph::compute_degree() {
    for (vertex_t i = 0; i < num_vertices_; ++i) {
        deg_.at(i) = (degree_t)succ_.at(i).size() + (degree_t)pred_.at(i).size();
    }
}